

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readChannelsAndLayers.cpp
# Opt level: O1

void readChannels(char *fileName)

{
  char *pcVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  InputFile file;
  InputFile local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_30,fileName,iVar3);
  Imf_3_4::InputFile::header();
  pcVar1 = (char *)Imf_3_4::Header::channels();
  p_Var4 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  while( true ) {
    p_Var2 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var4 == p_Var2) break;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  Imf_3_4::ChannelList::operator[](pcVar1);
  Imf_3_4::ChannelList::findChannel(pcVar1);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void
readChannels(const char fileName[])
{
    InputFile file (fileName);
   
    // [begin useIterator]
    const ChannelList &channels = file.header().channels();

    for (ChannelList::ConstIterator i = channels.begin(); i != channels.end(); ++i)
    {
        const Channel &channel = i.channel();
        // ...
    }
    // [end useIterator]
   
    // [begin directAccess]
    // const ChannelList &channels = file.header().channels();

    const Channel &channel = channels["G"];

    const Channel *channelPtr = channels.findChannel("G");
    // [end directAccess]
    
}